

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.h
# Opt level: O2

unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 __thiscall Client::read_until<std::__cxx11::stringstream>(Client *this,string *pattern)

{
  void *__buf;
  ssize_t sVar1;
  long lVar2;
  ulong in_RDX;
  int iVar3;
  long *in_FS_OFFSET;
  long *local_60;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  std::make_unique<std::__cxx11::stringstream>();
  __buf = (void *)(*in_FS_OFFSET + -0x19400);
  while( true ) {
    sVar1 = read(*(int *)&(pattern->_M_dataplus)._M_p,__buf,0x400);
    iVar3 = (int)sVar1;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,__buf,(long)iVar3 + (long)__buf);
    std::operator<<((ostream *)(local_60 + 2),(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    std::__cxx11::stringbuf::str();
    lVar2 = std::__cxx11::string::find((string *)local_50,in_RDX);
    std::__cxx11::string::~string((string *)local_50);
    if ((iVar3 == 0) || (lVar2 != -1)) break;
    if (iVar3 == -1) {
      *(undefined8 *)this = 0;
      if (local_60 != (long *)0x0) {
        (**(code **)(*local_60 + 8))();
      }
      return (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )this;
    }
  }
  *(long **)this = local_60;
  return (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> Client::read_until(const std::string& pattern) {
    std::unique_ptr<T> ss(std::make_unique<T>());

    while (true) {
        int read_count = read(socket , buffer, READ_BUFFER_SIZE); 
        *ss << std::string(buffer, read_count);
        if (ss->str().find(pattern) != std::string::npos || read_count == 0) {
            break;
        }
        if (read_count == EOF) {
            return nullptr;
        }
    }

    return ss;
}